

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O3

void * TPZAnalysis::ThreadData::ThreadWork(void *datavoid)

{
  long lVar1;
  long lVar2;
  TPZCompEl *pTVar3;
  int iVar4;
  TPZCompEl **ppTVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  TPZManVector<double,_10> errors;
  undefined8 local_a8;
  TPZManVector<double,_10> local_a0;
  
  lVar1 = *(long *)((long)datavoid + 8);
  TPZManVector<double,_10>::TPZManVector(&local_a0,10);
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)((long)datavoid + 0x2d08));
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  iVar4 = *(int *)((long)datavoid + 0x120);
  *(int *)((long)datavoid + 0x120) = iVar4 + 1;
  pthread_mutex_unlock((pthread_mutex_t *)((long)datavoid + 0x2d08));
  lVar8 = (long)iVar4 * 0x70;
  do {
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)((long)datavoid + 0x2d30));
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    lVar2 = *(long *)((long)datavoid + 0x118);
    *(long *)((long)datavoid + 0x118) = lVar2 + 1;
    pthread_mutex_unlock((pthread_mutex_t *)((long)datavoid + 0x2d30));
    if (lVar2 < lVar1) {
      ppTVar5 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          ((TPZChunkVector<TPZCompEl_*,_10> *)datavoid,lVar2);
      pTVar3 = *ppTVar5;
      if (pTVar3 != (TPZCompEl *)0x0) {
        (**(code **)(*(long *)pTVar3 + 0x138))
                  (pTVar3,&local_a0,*(undefined1 *)((long)datavoid + 0x124));
        uVar7 = (uint)local_a0.super_TPZVec<double>.fNElements;
        local_a8 = 0;
        (**(code **)(*(long *)(*(long *)((long)datavoid + 0x130) + lVar8) + 0x10))
                  (*(long *)((long)datavoid + 0x130) + lVar8,(long)(int)uVar7,&local_a8);
        if (0 < (int)uVar7) {
          lVar2 = *(long *)(*(long *)((long)datavoid + 0x130) + 8 + lVar8);
          uVar6 = 0;
          do {
            *(double *)(lVar2 + uVar6 * 8) =
                 local_a0.super_TPZVec<double>.fStore[uVar6] *
                 local_a0.super_TPZVec<double>.fStore[uVar6] + *(double *)(lVar2 + uVar6 * 8);
            uVar6 = uVar6 + 1;
          } while ((uVar7 & 0x7fffffff) != uVar6);
        }
      }
    }
  } while (*(long *)((long)datavoid + 0x118) < lVar1);
  TPZManVector<double,_10>::~TPZManVector(&local_a0);
  return datavoid;
}

Assistant:

void *TPZAnalysis::ThreadData::ThreadWork(void *datavoid)
{
  ThreadData *data = (ThreadData *) datavoid;
  const int64_t nelem = data->fElvec.NElements();
  TPZManVector<REAL,10> errors(10);
 
  // Getting unique id for each thread
  const int64_t myid = [&]()
  {
    std::scoped_lock lock(data->fMutexThreadId);
    const int64_t myid_loc = data->ftid;
    data->ftid++;
    return myid_loc;
  }();

  
  
  do{

    const int64_t iel = [&]()
    {
      std::scoped_lock lock(data->fMutexAccessEl);
      const int64_t iel_loc = data->fNextElement;
      data->fNextElement++;
      return iel_loc;
    }();
    
    // For all the elements it tries to get after the last one
    if ( iel >= nelem ) continue;
    
    TPZCompEl *cel = data->fElvec[iel];

    if(!cel) continue;
    
    cel->EvaluateError(errors, data->fStoreError);
    
    const int nerrors = errors.NElements();
    data->fvalues[myid].Resize(nerrors, 0.);


    for(int ier = 0; ier < nerrors; ier++)
    {
      (data->fvalues[myid])[ier] += errors[ier] * errors[ier];
    }
    
    
  } while (data->fNextElement < nelem);
  return data;
}